

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void __thiscall
LinearGE<1,_1>::LinearGE(LinearGE<1,_1> *this,vec<int> *a,vec<IntVar_*> *_x,int _c,BoolView *_r)

{
  IntVar *v;
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint *puVar4;
  IntVar **ppIVar5;
  undefined4 in_ECX;
  vec<IntVar_*> *in_RDX;
  vec<int> *in_RSI;
  undefined8 *in_RDI;
  uint i;
  BoolView *in_stack_ffffffffffffff08;
  Propagator *in_stack_ffffffffffffff10;
  undefined8 *puVar6;
  Propagator *in_stack_ffffffffffffff18;
  IntVar *in_stack_ffffffffffffff20;
  IntView<3> local_58;
  IntView<2> local_48;
  uint local_38;
  undefined4 local_1c;
  vec<IntVar_*> *local_18;
  vec<int> *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Propagator::Propagator(in_stack_ffffffffffffff10);
  *in_RDI = &PTR__LinearGE_0031e2c0;
  vec<IntVar_*>::size(local_18);
  vec<int>::vec((vec<int> *)in_stack_ffffffffffffff20,
                (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  vec<IntView<2>_>::vec((vec<IntView<2>_> *)(in_RDI + 5));
  vec<IntView<3>_>::vec((vec<IntView<3>_> *)(in_RDI + 7));
  *(undefined4 *)(in_RDI + 9) = local_1c;
  BoolView::BoolView((BoolView *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  in_RDI[0xe] = (long)-*(int *)(in_RDI + 9);
  vec<IntVar_*>::size(local_18);
  vec<Lit>::vec((vec<Lit> *)in_stack_ffffffffffffff20,
                (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  *(undefined4 *)((long)in_RDI + 0xc) = 2;
  local_38 = 0;
  while( true ) {
    uVar2 = local_38;
    uVar1 = vec<IntVar_*>::size(local_18);
    if (uVar1 <= uVar2) break;
    piVar3 = vec<int>::operator[](local_10,local_38);
    if (*piVar3 < 1) {
      uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 7));
      puVar4 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 3),local_38);
      *puVar4 = ~uVar2;
      ppIVar5 = vec<IntVar_*>::operator[](local_18,local_38);
      in_stack_ffffffffffffff20 = *ppIVar5;
      piVar3 = vec<int>::operator[](local_10,local_38);
      IntView<3>::IntView(&local_58,in_stack_ffffffffffffff20,-*piVar3,0);
      vec<IntView<3>_>::push
                ((vec<IntView<3>_> *)in_stack_ffffffffffffff20,
                 (IntView<3> *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff18 = (Propagator *)vec<IntVar_*>::operator[](local_18,local_38);
      (*(((IntVar *)in_stack_ffffffffffffff18->_vptr_Propagator)->super_Var).super_Branching.
        _vptr_Branching[7])
                ((IntVar *)in_stack_ffffffffffffff18->_vptr_Propagator,in_RDI,(ulong)local_38,2);
    }
    else {
      uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 5));
      puVar4 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 3),local_38);
      *puVar4 = uVar2;
      ppIVar5 = vec<IntVar_*>::operator[](local_18,local_38);
      v = *ppIVar5;
      piVar3 = vec<int>::operator[](local_10,local_38);
      IntView<2>::IntView(&local_48,v,*piVar3,0);
      vec<IntView<2>_>::push
                ((vec<IntView<2>_> *)in_stack_ffffffffffffff20,
                 (IntView<2> *)in_stack_ffffffffffffff18);
      ppIVar5 = vec<IntVar_*>::operator[](local_18,local_38);
      (*((*ppIVar5)->super_Var).super_Branching._vptr_Branching[7])
                (*ppIVar5,in_RDI,(ulong)local_38,4);
    }
    local_38 = local_38 + 1;
  }
  puVar6 = in_RDI + 10;
  vec<IntVar_*>::size(local_18);
  BoolView::attach((BoolView *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (int)((ulong)puVar6 >> 0x20),(int)puVar6);
  return;
}

Assistant:

LinearGE(vec<int>& a, vec<IntVar*>& _x, int _c, BoolView _r = bv_true)
			: pos(_x.size()),
				c(_c),
				r(std::move(_r)),

				fix_sum(-c),
				ps(R + _x.size()) {
		priority = 2;

		for (unsigned int i = 0; i < _x.size(); i++) {
			assert(a[i]);
			if (a[i] > 0) {
				pos[i] = x.size();
				x.push(IntView<2 * S>(_x[i], a[i]));
				_x[i]->attach(this, i, EVENT_U);
			} else {
				pos[i] = -static_cast<int>(y.size()) - 1;
				y.push(IntView<2 * S + 1>(_x[i], -a[i]));
				_x[i]->attach(this, i, EVENT_L);
			}
		}
		if (R != 0) {
			r.attach(this, _x.size(), EVENT_L);
		}
	}